

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O3

int __thiscall
ncnn::RNN::forward(RNN *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  size_t sVar2;
  pointer pMVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  void *__src;
  void *__dest;
  bool bVar8;
  Mat local_288;
  Mat m;
  Mat hidden1;
  Mat m_4;
  Mat m_1;
  Mat m_2;
  Mat m_5;
  Mat m_8;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.elemsize._4_4_ = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0x90];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0x90) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0x90,_allocator);
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          if (local_288.data != (void *)0x0) {
            free(local_288.data);
          }
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_288.data = m.data;
    local_288.refcount._0_4_ = m.refcount._0_4_;
    local_288.refcount._4_4_ = m.refcount._4_4_;
    local_288.elemsize._0_4_ = (undefined4)m.elemsize;
    local_288.elemsize._4_4_ = m.elemsize._4_4_;
    local_288.elempack = m.elempack;
    local_288.allocator = m.allocator;
    local_288.dims = m.dims;
    local_288.w = m.w;
    local_288.h = m.h;
    local_288.d = m.d;
    local_288.c = m.c;
    local_288.cstep = m.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::create(&local_288,this->num_output,(iVar1 == 2) + 1,4,_allocator);
    iVar6 = -100;
    if ((local_288.data == (void *)0x0) || (local_288.cstep * (long)local_288.c == 0))
    goto LAB_0021566c;
    uVar5 = (int)local_288.cstep * local_288.c;
    if (0 < (int)uVar5) {
      memset(local_288.data,0,(ulong)uVar5 << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  iVar6 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar5 = this->direction;
    if (uVar5 < 2) {
      bVar8 = (this->weight_xc_data).dims == 3;
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.c = 1;
      if (!bVar8) {
        m.c = (this->weight_xc_data).d;
      }
      m.dims = bVar8 ^ 3;
      m.data = (this->weight_xc_data).data;
      sVar2 = (this->weight_xc_data).elemsize;
      m.elempack = (this->weight_xc_data).elempack;
      m.allocator = (this->weight_xc_data).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)sVar2;
      m.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      m.cstep = (long)m.h * (long)m.w;
      m.d = 1;
      bVar8 = (this->bias_c_data).dims == 3;
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.c = 1;
      if (!bVar8) {
        m_1.c = (this->bias_c_data).d;
      }
      m_1.dims = bVar8 ^ 3;
      m_1.data = (this->bias_c_data).data;
      sVar2 = (this->bias_c_data).elemsize;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)sVar2;
      m_1.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      m_1.cstep = (long)m_1.h * (long)m_1.w;
      m_1.d = 1;
      bVar8 = (this->weight_hc_data).dims == 3;
      m_2.w = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = 1;
      if (!bVar8) {
        m_2.c = (this->weight_hc_data).d;
      }
      m_2.dims = bVar8 ^ 3;
      m_2.data = (this->weight_hc_data).data;
      m_2.elemsize = (this->weight_hc_data).elemsize;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.refcount = (int *)0x0;
      m_2.cstep = (long)m_2.h * (long)m_2.w;
      m_2.d = 1;
      iVar6 = rnn(bottom_blob,this_00,uVar5,&m,&m_1,&m_2,&local_288,
                  (Option *)opt->workspace_allocator);
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (iVar6 != 0) goto LAB_0021566c;
      uVar5 = this->direction;
    }
    if (uVar5 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
      iVar6 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar8 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
        iVar6 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar8 = false;
        }
        else {
          m_2.cstep = (size_t)local_288.w;
          m_2.elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
          m_2.data = local_288.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_288.elempack;
          m_2.allocator = local_288.allocator;
          m_2.dims = 2;
          m_2.w = local_288.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          bVar8 = (this->weight_xc_data).dims == 3;
          hidden1.w = (this->weight_xc_data).w;
          hidden1.h = (this->weight_xc_data).h;
          hidden1.c = 1;
          if (!bVar8) {
            hidden1.c = (this->weight_xc_data).d;
          }
          hidden1.dims = bVar8 ^ 3;
          hidden1.data = (this->weight_xc_data).data;
          hidden1.elemsize = (this->weight_xc_data).elemsize;
          hidden1.elempack = (this->weight_xc_data).elempack;
          hidden1.allocator = (this->weight_xc_data).allocator;
          hidden1.refcount = (int *)0x0;
          hidden1.cstep = (long)hidden1.h * (long)hidden1.w;
          hidden1.d = 1;
          bVar8 = (this->bias_c_data).dims == 3;
          m_4.w = (this->bias_c_data).w;
          m_4.h = (this->bias_c_data).h;
          m_4.c = 1;
          if (!bVar8) {
            m_4.c = (this->bias_c_data).d;
          }
          m_4.dims = bVar8 ^ 3;
          m_4.data = (this->bias_c_data).data;
          m_4.elemsize = (this->bias_c_data).elemsize;
          m_4.elempack = (this->bias_c_data).elempack;
          m_4.allocator = (this->bias_c_data).allocator;
          m_4.refcount = (int *)0x0;
          m_4.cstep = (long)m_4.h * (long)m_4.w;
          m_4.d = 1;
          bVar8 = (this->weight_hc_data).dims == 3;
          m_5.w = (this->weight_hc_data).w;
          m_5.h = (this->weight_hc_data).h;
          m_5.c = 1;
          if (!bVar8) {
            m_5.c = (this->weight_hc_data).d;
          }
          m_5.dims = bVar8 ^ 3;
          m_5.data = (this->weight_hc_data).data;
          m_5.elemsize = (this->weight_hc_data).elemsize;
          m_5.elempack = (this->weight_hc_data).elempack;
          m_5.allocator = (this->weight_hc_data).allocator;
          m_5.refcount = (int *)0x0;
          m_5.cstep = (long)m_5.h * (long)m_5.w;
          m_5.d = 1;
          iVar6 = rnn(bottom_blob,&m,0,&hidden1,&m_4,&m_5,&m_2,(Option *)opt->workspace_allocator);
          if (hidden1.refcount != (int *)0x0) {
            LOCK();
            *hidden1.refcount = *hidden1.refcount + -1;
            UNLOCK();
            if (*hidden1.refcount == 0) {
              if (hidden1.allocator == (Allocator *)0x0) {
                if (hidden1.data != (void *)0x0) {
                  free(hidden1.data);
                }
              }
              else {
                (*(hidden1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (iVar6 == 0) {
            hidden1.cstep = (size_t)local_288.w;
            hidden1.elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
            hidden1.data = (void *)(hidden1.elemsize * hidden1.cstep + (long)local_288.data);
            hidden1.refcount = (int *)0x0;
            hidden1.elempack = local_288.elempack;
            hidden1.allocator = local_288.allocator;
            hidden1.dims = 2;
            hidden1.w = local_288.w;
            hidden1.h = 1;
            hidden1.d = 1;
            hidden1.c = 1;
            bVar8 = (this->weight_xc_data).dims == 3;
            m_4.w = (this->weight_xc_data).w;
            m_4.h = (this->weight_xc_data).h;
            m_4.c = 1;
            if (!bVar8) {
              m_4.c = (this->weight_xc_data).d;
            }
            m_4.dims = bVar8 ^ 3;
            m_4.elemsize = (this->weight_xc_data).elemsize;
            m_4.data = (void *)((this->weight_xc_data).cstep * m_4.elemsize +
                               (long)(this->weight_xc_data).data);
            m_4.elempack = (this->weight_xc_data).elempack;
            m_4.allocator = (this->weight_xc_data).allocator;
            m_4.refcount = (int *)0x0;
            m_4.cstep = (long)m_4.h * (long)m_4.w;
            m_4.d = 1;
            bVar8 = (this->bias_c_data).dims == 3;
            m_5.w = (this->bias_c_data).w;
            m_5.h = (this->bias_c_data).h;
            m_5.c = 1;
            if (!bVar8) {
              m_5.c = (this->bias_c_data).d;
            }
            m_5.dims = bVar8 ^ 3;
            m_5.elemsize = (this->bias_c_data).elemsize;
            m_5.data = (void *)((this->bias_c_data).cstep * m_5.elemsize +
                               (long)(this->bias_c_data).data);
            m_5.elempack = (this->bias_c_data).elempack;
            m_5.allocator = (this->bias_c_data).allocator;
            m_5.refcount = (int *)0x0;
            m_5.cstep = (long)m_5.h * (long)m_5.w;
            m_5.d = 1;
            bVar8 = (this->weight_hc_data).dims == 3;
            m_8.w = (this->weight_hc_data).w;
            m_8.h = (this->weight_hc_data).h;
            m_8.c = 1;
            if (!bVar8) {
              m_8.c = (this->weight_hc_data).d;
            }
            m_8.dims = bVar8 ^ 3;
            m_8.elemsize = (this->weight_hc_data).elemsize;
            m_8.data = (void *)((this->weight_hc_data).cstep * m_8.elemsize +
                               (long)(this->weight_hc_data).data);
            m_8.elempack = (this->weight_hc_data).elempack;
            m_8.allocator = (this->weight_hc_data).allocator;
            m_8.refcount = (int *)0x0;
            m_8.cstep = (long)m_8.h * (long)m_8.w;
            m_8.d = 1;
            iVar6 = rnn(bottom_blob,&m_1,1,&m_4,&m_5,&m_8,&hidden1,
                        (Option *)opt->workspace_allocator);
            Mat::~Mat(&m_8);
            Mat::~Mat(&m_5);
            Mat::~Mat(&m_4);
            bVar8 = iVar6 == 0;
            if (bVar8) {
              if ((int)_h < 1) {
                iVar6 = 0;
              }
              else {
                iVar6 = 0;
                uVar7 = 0;
                do {
                  __src = (void *)((long)m_1.w * uVar7 *
                                   CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                  (long)m_1.data);
                  __dest = (void *)((long)this_00->w * uVar7 * this_00->elemsize +
                                   (long)this_00->data);
                  memcpy(__dest,(void *)((long)m.w * uVar7 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                        (long)m.data),(long)this->num_output << 2);
                  memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                         (long)this->num_output << 2);
                  uVar7 = uVar7 + 1;
                } while (_h != uVar7);
              }
            }
            Mat::~Mat(&hidden1);
          }
          else {
            bVar8 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar8) goto LAB_0021566c;
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = 0;
    if (((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pMVar3 == 0x90) &&
       (pMVar3 + 1 != &local_288)) {
      piVar4 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = pMVar3[1].refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pMVar3[1].allocator == (Allocator *)0x0) {
            if (pMVar3[1].data != (void *)0x0) {
              free(pMVar3[1].data);
            }
          }
          else {
            (*(pMVar3[1].allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar6 = 0;
      pMVar3[1].data = local_288.data;
      pMVar3[1].refcount = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      pMVar3[1].elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
      pMVar3[1].elempack = local_288.elempack;
      pMVar3[1].allocator = local_288.allocator;
      pMVar3[1].dims = local_288.dims;
      pMVar3[1].w = local_288.w;
      pMVar3[1].h = local_288.h;
      pMVar3[1].d = local_288.d;
      pMVar3[1].c = local_288.c;
      pMVar3[1].cstep = local_288.cstep;
    }
  }
LAB_0021566c:
  piVar4 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar6;
}

Assistant:

int RNN::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Allocator* hidden_allocator = top_blobs.size() == 2 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 2)
    {
        hidden = bottom_blobs[1].clone(hidden_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = rnn(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        int ret0 = rnn(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        int ret1 = rnn(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 2)
    {
        top_blobs[1] = hidden;
    }

    return 0;
}